

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmAddCustomCommandCommand.cxx
# Opt level: O2

bool __thiscall
cmAddCustomCommandCommand::InitialPass
          (cmAddCustomCommandCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args,cmExecutionStatus *param_2)

{
  cmMakefile *this_00;
  bool bVar1;
  bool bVar2;
  byte bVar3;
  PolicyStatus PVar4;
  pointer pbVar5;
  cmSourceFile *pcVar6;
  cmCustomCommand *pcVar7;
  char *in_base;
  ostream *poVar8;
  PolicyID id;
  bool bVar9;
  MessageType t;
  int iVar10;
  uint uVar11;
  pointer pbVar12;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  CustomCommandType local_3b4;
  string filename;
  bool local_390;
  char *local_380;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  output;
  cmCustomCommandLine currentLine;
  cmCustomCommandLines commandLines;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  byproducts;
  ImplicitDependsList implicit_depends;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  depends;
  string working;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  outputs;
  string target;
  string source;
  string dep_1;
  string dep;
  string implicit_depends_lang;
  string comment_buffer;
  string main_dependency;
  
  pbVar12 = (args->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  pbVar5 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if ((ulong)((long)pbVar5 - (long)pbVar12) < 0x80) {
    std::__cxx11::string::string
              ((string *)&dep,"called with wrong number of arguments.",(allocator *)&source);
    cmCommand::SetError(&this->super_cmCommand,&dep);
    std::__cxx11::string::~string((string *)&dep);
    return false;
  }
  source._M_dataplus._M_p = (pointer)&source.field_2;
  source._M_string_length = 0;
  source.field_2._M_local_buf[0] = '\0';
  target._M_dataplus._M_p = (pointer)&target.field_2;
  target._M_string_length = 0;
  main_dependency._M_dataplus._M_p = (pointer)&main_dependency.field_2;
  main_dependency._M_string_length = 0;
  target.field_2._M_local_buf[0] = '\0';
  main_dependency.field_2._M_local_buf[0] = '\0';
  working._M_dataplus._M_p = (pointer)&working.field_2;
  working._M_string_length = 0;
  comment_buffer._M_dataplus._M_p = (pointer)&comment_buffer.field_2;
  comment_buffer._M_string_length = 0;
  working.field_2._M_local_buf[0] = '\0';
  comment_buffer.field_2._M_local_buf[0] = '\0';
  depends.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  depends.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  depends.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  outputs.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  output.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  outputs.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  outputs.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  output.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  output.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  byproducts.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  byproducts.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  byproducts.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  implicit_depends_lang._M_dataplus._M_p = (pointer)&implicit_depends_lang.field_2;
  implicit_depends_lang._M_string_length = 0;
  implicit_depends.
  super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  .
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  implicit_depends_lang.field_2._M_local_buf[0] = '\0';
  implicit_depends.
  super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  .
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  implicit_depends.
  super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  .
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  currentLine.
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  currentLine.
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  currentLine.
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  commandLines.super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>.
  super__Vector_base<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  commandLines.super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>.
  super__Vector_base<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  commandLines.super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>.
  super__Vector_base<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  iVar10 = 0xc;
  local_3b4 = POST_BUILD;
  bVar9 = false;
  bVar1 = false;
  bVar3 = 0;
  local_380 = (char *)0x0;
  for (uVar11 = 0; (ulong)uVar11 < (ulong)((long)pbVar5 - (long)pbVar12 >> 5); uVar11 = uVar11 + 1)
  {
    __lhs = pbVar12 + uVar11;
    bVar2 = std::operator==(__lhs,"SOURCE");
    if (bVar2) {
      iVar10 = 0;
      goto LAB_003479fb;
    }
    bVar2 = std::operator==(__lhs,"COMMAND");
    if (bVar2) {
      if (currentLine.
          super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          currentLine.
          super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        std::vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>::push_back
                  (&commandLines.
                    super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>,
                   (value_type *)
                   &currentLine.
                    super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  );
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::clear(&currentLine.
                 super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               );
      }
      iVar10 = 1;
      goto LAB_003479fb;
    }
    bVar2 = std::operator==(__lhs,"PRE_BUILD");
    if (bVar2) {
      local_3b4 = PRE_BUILD;
      goto LAB_003479fb;
    }
    bVar2 = std::operator==(__lhs,"PRE_LINK");
    if (bVar2) {
      local_3b4 = PRE_LINK;
      goto LAB_003479fb;
    }
    bVar2 = std::operator==(__lhs,"POST_BUILD");
    if (bVar2) {
      local_3b4 = POST_BUILD;
      goto LAB_003479fb;
    }
    bVar2 = std::operator==(__lhs,"VERBATIM");
    if (bVar2) {
      bVar3 = 1;
      goto LAB_003479fb;
    }
    bVar2 = std::operator==(__lhs,"APPEND");
    if (bVar2) {
      bVar1 = true;
      goto LAB_003479fb;
    }
    bVar2 = std::operator==(__lhs,"USES_TERMINAL");
    if (bVar2) {
      bVar9 = true;
      goto LAB_003479fb;
    }
    bVar2 = std::operator==(__lhs,"TARGET");
    if (bVar2) {
      iVar10 = 2;
      goto LAB_003479fb;
    }
    bVar2 = std::operator==(__lhs,"ARGS");
    if (bVar2) goto LAB_003479fb;
    bVar2 = std::operator==(__lhs,"DEPENDS");
    if (bVar2) {
      iVar10 = 3;
      goto LAB_003479fb;
    }
    bVar2 = std::operator==(__lhs,"OUTPUTS");
    if (bVar2) {
      iVar10 = 8;
      goto LAB_003479fb;
    }
    bVar2 = std::operator==(__lhs,"OUTPUT");
    if (bVar2) {
      iVar10 = 7;
      goto LAB_003479fb;
    }
    bVar2 = std::operator==(__lhs,"BYPRODUCTS");
    if (bVar2) {
      iVar10 = 9;
      goto LAB_003479fb;
    }
    bVar2 = std::operator==(__lhs,"WORKING_DIRECTORY");
    if (bVar2) {
      iVar10 = 0xb;
      goto LAB_003479fb;
    }
    bVar2 = std::operator==(__lhs,"MAIN_DEPENDENCY");
    if (bVar2) {
      iVar10 = 6;
      goto LAB_003479fb;
    }
    bVar2 = std::operator==(__lhs,"IMPLICIT_DEPENDS");
    if (bVar2) {
      iVar10 = 4;
      goto LAB_003479fb;
    }
    bVar2 = std::operator==(__lhs,"COMMENT");
    if (bVar2) {
      iVar10 = 10;
      goto LAB_003479fb;
    }
    filename._M_dataplus._M_p = (pointer)&filename.field_2;
    filename._M_string_length = 0;
    filename.field_2._M_local_buf[0] = '\0';
    if (iVar10 - 7U < 3) {
      bVar2 = cmsys::SystemTools::FileIsFullPath((__lhs->_M_dataplus)._M_p);
      if (!bVar2) {
        cmMakefile::GetCurrentBinaryDirectory((this->super_cmCommand).Makefile);
        std::__cxx11::string::assign((char *)&filename);
        std::__cxx11::string::append((char *)&filename);
      }
      std::__cxx11::string::append((string *)&filename);
      cmsys::SystemTools::ConvertToUnixSlashes(&filename);
    }
    bVar2 = cmsys::SystemTools::FileIsFullPath(filename._M_dataplus._M_p);
    if (bVar2) {
      cmsys::SystemTools::CollapseFullPath(&dep,&filename);
      std::__cxx11::string::operator=((string *)&filename,(string *)&dep);
      std::__cxx11::string::~string((string *)&dep);
    }
    switch(iVar10) {
    case 0:
      std::__cxx11::string::_M_assign((string *)&source);
      bVar2 = true;
      iVar10 = 0;
      break;
    case 1:
      bVar2 = true;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&currentLine.
                   super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ,__lhs);
      iVar10 = 1;
      break;
    case 2:
      bVar2 = true;
      std::__cxx11::string::_M_assign((string *)&target);
      iVar10 = 2;
      break;
    case 3:
      std::__cxx11::string::string((string *)&dep,(string *)__lhs);
      cmsys::SystemTools::ConvertToUnixSlashes(&dep);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&depends,&dep);
      std::__cxx11::string::~string((string *)&dep);
      iVar10 = 3;
      goto LAB_00347e2c;
    case 4:
      bVar2 = true;
      std::__cxx11::string::_M_assign((string *)&implicit_depends_lang);
      iVar10 = 5;
      break;
    case 5:
      std::__cxx11::string::string((string *)&dep_1,(string *)__lhs);
      cmsys::SystemTools::ConvertToUnixSlashes(&dep_1);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&depends,&dep_1);
      std::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_true>
                ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&dep,&implicit_depends_lang,&dep_1);
      std::
      vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::push_back(&implicit_depends.
                   super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ,(value_type *)&dep);
      std::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&dep);
      std::__cxx11::string::~string((string *)&dep_1);
      iVar10 = 4;
      goto LAB_00347e2c;
    case 6:
      bVar2 = true;
      std::__cxx11::string::_M_assign((string *)&main_dependency);
      iVar10 = 6;
      break;
    case 7:
      bVar2 = true;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&output,&filename);
      iVar10 = 7;
      break;
    case 8:
      bVar2 = true;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&outputs,&filename);
      iVar10 = 8;
      break;
    case 9:
      bVar2 = true;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&byproducts,&filename);
      iVar10 = 9;
      break;
    case 10:
      std::__cxx11::string::_M_assign((string *)&comment_buffer);
      local_380 = comment_buffer._M_dataplus._M_p;
      iVar10 = 10;
LAB_00347e2c:
      bVar2 = true;
      break;
    case 0xb:
      bVar2 = true;
      std::__cxx11::string::_M_assign((string *)&working);
      iVar10 = 0xb;
      break;
    default:
      std::__cxx11::string::string
                ((string *)&dep,"Wrong syntax. Unknown type of argument.",(allocator *)&dep_1);
      cmCommand::SetError(&this->super_cmCommand,&dep);
      std::__cxx11::string::~string((string *)&dep);
      bVar2 = false;
    }
    std::__cxx11::string::~string((string *)&filename);
    if (!bVar2) goto LAB_00347f9e;
LAB_003479fb:
    pbVar12 = (args->
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )._M_impl.super__Vector_impl_data._M_start;
    pbVar5 = (args->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
  }
  if (currentLine.
      super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      currentLine.
      super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    std::vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>::push_back
              (&commandLines.super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>
               ,&currentLine);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::clear(&currentLine.
             super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           );
  }
  if (output.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      output.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish && target._M_string_length == 0) {
    std::__cxx11::string::string
              ((string *)&dep,"Wrong syntax. A TARGET or OUTPUT must be specified.",
               (allocator *)&filename);
    cmCommand::SetError(&this->super_cmCommand,&dep);
LAB_00347f91:
    std::__cxx11::string::~string((string *)&dep);
  }
  else {
    if (source._M_string_length == 0 && target._M_string_length != 0) {
      if (output.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start ==
          output.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        if (bVar1) goto LAB_00347f68;
        bVar1 = false;
        goto LAB_00348060;
      }
      std::__cxx11::string::string
                ((string *)&dep,"Wrong syntax. A TARGET and OUTPUT can not both be specified.",
                 (allocator *)&filename);
      cmCommand::SetError(&this->super_cmCommand,&dep);
      goto LAB_00347f91;
    }
    if ((bool)(bVar1 & output.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start ==
                       output.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish)) {
LAB_00347f68:
      std::__cxx11::string::string
                ((string *)&dep,"given APPEND option with no OUTPUT.",(allocator *)&filename);
      cmCommand::SetError(&this->super_cmCommand,&dep);
      goto LAB_00347f91;
    }
LAB_00348060:
    bVar2 = CheckOutputs(this,&output);
    if (((bVar2) && (bVar2 = CheckOutputs(this,&outputs), bVar2)) &&
       (bVar2 = CheckOutputs(this,&byproducts), bVar2)) {
      if (!bVar1) {
        if (working._M_string_length != 0) {
          in_base = cmMakefile::GetCurrentBinaryDirectory((this->super_cmCommand).Makefile);
          cmsys::SystemTools::CollapseFullPath(&dep,&working,in_base);
          std::__cxx11::string::operator=((string *)&working,(string *)&dep);
          std::__cxx11::string::~string((string *)&dep);
        }
        local_390 = (bool)(bVar3 ^ 1);
        if ((source._M_string_length == 0) &&
           (output.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start ==
            output.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish)) {
          dep._M_dataplus._M_p = (pointer)0x0;
          dep._M_string_length = 0;
          dep.field_2._M_allocated_capacity = 0;
          cmMakefile::AddCustomCommandToTarget
                    ((this->super_cmCommand).Makefile,&target,&byproducts,
                     (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&dep,&commandLines,local_3b4,local_380,working._M_dataplus._M_p,local_390,
                     bVar9);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&dep);
LAB_00348515:
          bVar9 = true;
          goto LAB_00347fa0;
        }
        if (target._M_string_length == 0) {
          cmMakefile::AddCustomCommandToOutput
                    ((this->super_cmCommand).Makefile,&output,&byproducts,&depends,&main_dependency,
                     &commandLines,local_380,working._M_dataplus._M_p,false,local_390,bVar9);
          bVar9 = true;
          if (implicit_depends.
              super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              .
              super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start ==
              implicit_depends.
              super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              .
              super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish) goto LAB_00347fa0;
          pcVar6 = cmMakefile::GetSourceFileWithOutput
                             ((this->super_cmCommand).Makefile,
                              output.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start);
          if ((pcVar6 != (cmSourceFile *)0x0) &&
             (pcVar7 = cmSourceFile::GetCustomCommand(pcVar6), pcVar7 != (cmCustomCommand *)0x0)) {
            cmCustomCommand::SetImplicitDepends(pcVar7,&implicit_depends);
            goto LAB_00347fa0;
          }
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&dep);
          poVar8 = std::operator<<((ostream *)&dep,
                                   "could not locate source file with a custom command producing \""
                                  );
          poVar8 = std::operator<<(poVar8,(string *)
                                          output.
                                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start);
          std::operator<<(poVar8,"\" even though this command tried to create it!");
          std::__cxx11::stringbuf::str();
          cmCommand::SetError(&this->super_cmCommand,&filename);
          goto LAB_00348230;
        }
        if (byproducts.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start ==
            byproducts.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish) {
          if (!bVar9) {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)&dep);
            PVar4 = cmMakefile::GetPolicyStatus((this->super_cmCommand).Makefile,CMP0050);
            if (PVar4 - NEW < 3) {
              t = FATAL_ERROR;
              bVar9 = true;
LAB_00348480:
              std::operator<<((ostream *)&dep,
                              "The SOURCE signatures of add_custom_command are no longer supported."
                             );
              this_00 = (this->super_cmCommand).Makefile;
              std::__cxx11::stringbuf::str();
              cmMakefile::IssueMessage(this_00,t,&filename);
              std::__cxx11::string::~string((string *)&filename);
              if (bVar9) goto LAB_0034823a;
            }
            else if (PVar4 != OLD) {
              bVar9 = false;
              t = AUTHOR_WARNING;
              if (PVar4 == WARN) {
                cmPolicies::GetPolicyWarning_abi_cxx11_(&filename,(cmPolicies *)0x32,id);
                poVar8 = std::operator<<((ostream *)&dep,(string *)&filename);
                std::operator<<(poVar8,"\n");
                std::__cxx11::string::~string((string *)&filename);
                bVar9 = false;
                t = AUTHOR_WARNING;
              }
              goto LAB_00348480;
            }
            cmMakefile::AddCustomCommandOldStyle
                      ((this->super_cmCommand).Makefile,&target,&outputs,&depends,&source,
                       &commandLines,local_380);
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)&dep);
            goto LAB_00348515;
          }
          std::__cxx11::string::string
                    ((string *)&dep,"USES_TERMINAL may not be used with SOURCE signatures",
                     (allocator *)&filename);
          cmCommand::SetError(&this->super_cmCommand,&dep);
        }
        else {
          std::__cxx11::string::string
                    ((string *)&dep,"BYPRODUCTS may not be specified with SOURCE signatures",
                     (allocator *)&filename);
          cmCommand::SetError(&this->super_cmCommand,&dep);
        }
        goto LAB_00347f91;
      }
      pcVar6 = cmMakefile::GetSourceFileWithOutput
                         ((this->super_cmCommand).Makefile,
                          output.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
      if ((pcVar6 != (cmSourceFile *)0x0) &&
         (pcVar7 = cmSourceFile::GetCustomCommand(pcVar6), pcVar7 != (cmCustomCommand *)0x0)) {
        cmCustomCommand::AppendCommands(pcVar7,&commandLines);
        cmCustomCommand::AppendDepends(pcVar7,&depends);
        bVar9 = true;
        cmCustomCommand::AppendImplicitDepends(pcVar7,&implicit_depends);
        goto LAB_00347fa0;
      }
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&dep);
      poVar8 = std::operator<<((ostream *)&dep,"given APPEND option with output \"");
      poVar8 = std::operator<<(poVar8,(string *)
                                      output.
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start);
      std::operator<<(poVar8,"\" which is not already a custom command output.");
      std::__cxx11::stringbuf::str();
      cmCommand::SetError(&this->super_cmCommand,&filename);
LAB_00348230:
      std::__cxx11::string::~string((string *)&filename);
LAB_0034823a:
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&dep);
    }
  }
LAB_00347f9e:
  bVar9 = false;
LAB_00347fa0:
  std::vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>::~vector
            (&commandLines.super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&currentLine.
             super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           );
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~vector(&implicit_depends.
             super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           );
  std::__cxx11::string::~string((string *)&implicit_depends_lang);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&byproducts);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&output);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&outputs);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&depends);
  std::__cxx11::string::~string((string *)&comment_buffer);
  std::__cxx11::string::~string((string *)&working);
  std::__cxx11::string::~string((string *)&main_dependency);
  std::__cxx11::string::~string((string *)&target);
  std::__cxx11::string::~string((string *)&source);
  return bVar9;
}

Assistant:

bool cmAddCustomCommandCommand
::InitialPass(std::vector<std::string> const& args, cmExecutionStatus &)
{
  /* Let's complain at the end of this function about the lack of a particular
     arg. For the moment, let's say that COMMAND, and either TARGET or SOURCE
     are required.
  */
  if (args.size() < 4)
    {
      this->SetError("called with wrong number of arguments.");
      return false;
    }

  std::string source, target, main_dependency, working;
  std::string comment_buffer;
  const char* comment = 0;
  std::vector<std::string> depends, outputs, output, byproducts;
  bool verbatim = false;
  bool append = false;
  bool uses_terminal = false;
  std::string implicit_depends_lang;
  cmCustomCommand::ImplicitDependsList implicit_depends;

  // Accumulate one command line at a time.
  cmCustomCommandLine currentLine;

  // Save all command lines.
  cmCustomCommandLines commandLines;

  cmTarget::CustomCommandType cctype = cmTarget::POST_BUILD;

  enum tdoing {
    doing_source,
    doing_command,
    doing_target,
    doing_depends,
    doing_implicit_depends_lang,
    doing_implicit_depends_file,
    doing_main_dependency,
    doing_output,
    doing_outputs,
    doing_byproducts,
    doing_comment,
    doing_working_directory,
    doing_nothing
  };

  tdoing doing = doing_nothing;

  for (unsigned int j = 0; j < args.size(); ++j)
    {
    std::string const& copy = args[j];

    if(copy == "SOURCE")
      {
      doing = doing_source;
      }
    else if(copy == "COMMAND")
      {
      doing = doing_command;

      // Save the current command before starting the next command.
      if(!currentLine.empty())
        {
        commandLines.push_back(currentLine);
        currentLine.clear();
        }
      }
    else if(copy == "PRE_BUILD")
      {
      cctype = cmTarget::PRE_BUILD;
      }
    else if(copy == "PRE_LINK")
      {
      cctype = cmTarget::PRE_LINK;
      }
    else if(copy == "POST_BUILD")
      {
      cctype = cmTarget::POST_BUILD;
      }
    else if(copy == "VERBATIM")
      {
      verbatim = true;
      }
    else if(copy == "APPEND")
      {
      append = true;
      }
    else if(copy == "USES_TERMINAL")
      {
      uses_terminal = true;
      }
    else if(copy == "TARGET")
      {
      doing = doing_target;
      }
    else if(copy == "ARGS")
      {
      // Ignore this old keyword.
      }
    else if (copy == "DEPENDS")
      {
      doing = doing_depends;
      }
    else if (copy == "OUTPUTS")
      {
      doing = doing_outputs;
      }
    else if (copy == "OUTPUT")
      {
      doing = doing_output;
      }
    else if (copy == "BYPRODUCTS")
      {
      doing = doing_byproducts;
      }
    else if (copy == "WORKING_DIRECTORY")
      {
      doing = doing_working_directory;
      }
    else if (copy == "MAIN_DEPENDENCY")
      {
      doing = doing_main_dependency;
      }
    else if (copy == "IMPLICIT_DEPENDS")
      {
      doing = doing_implicit_depends_lang;
      }
    else if (copy == "COMMENT")
      {
      doing = doing_comment;
      }
    else
      {
      std::string filename;
      switch (doing)
        {
        case doing_output:
        case doing_outputs:
        case doing_byproducts:
          if (!cmSystemTools::FileIsFullPath(copy.c_str()))
            {
            // This is an output to be generated, so it should be
            // under the build tree.  CMake 2.4 placed this under the
            // source tree.  However the only case that this change
            // will break is when someone writes
            //
            //   add_custom_command(OUTPUT out.txt ...)
            //
            // and later references "${CMAKE_CURRENT_SOURCE_DIR}/out.txt".
            // This is fairly obscure so we can wait for someone to
            // complain.
            filename = this->Makefile->GetCurrentBinaryDirectory();
            filename += "/";
            }
          filename += copy;
          cmSystemTools::ConvertToUnixSlashes(filename);
          break;
        case doing_source:
          // We do not want to convert the argument to SOURCE because
          // that option is only available for backward compatibility.
          // Old-style use of this command may use the SOURCE==TARGET
          // trick which we must preserve.  If we convert the source
          // to a full path then it will no longer equal the target.
        default:
          break;
        }

      if (cmSystemTools::FileIsFullPath(filename.c_str()))
        {
        filename = cmSystemTools::CollapseFullPath(filename);
        }
       switch (doing)
         {
         case doing_working_directory:
           working = copy;
           break;
         case doing_source:
           source = copy;
           break;
         case doing_output:
           output.push_back(filename);
           break;
         case doing_main_dependency:
           main_dependency = copy;
           break;
         case doing_implicit_depends_lang:
           implicit_depends_lang = copy;
           doing = doing_implicit_depends_file;
           break;
         case doing_implicit_depends_file:
           {
           // An implicit dependency starting point is also an
           // explicit dependency.
           std::string dep = copy;
           cmSystemTools::ConvertToUnixSlashes(dep);
           depends.push_back(dep);

           // Add the implicit dependency language and file.
           cmCustomCommand::ImplicitDependsPair
             entry(implicit_depends_lang, dep);
           implicit_depends.push_back(entry);

           // Switch back to looking for a language.
           doing = doing_implicit_depends_lang;
           }
           break;
         case doing_command:
           currentLine.push_back(copy);
           break;
         case doing_target:
           target = copy;
           break;
         case doing_depends:
           {
           std::string dep = copy;
           cmSystemTools::ConvertToUnixSlashes(dep);
           depends.push_back(dep);
           }
           break;
         case doing_outputs:
           outputs.push_back(filename);
           break;
         case doing_byproducts:
           byproducts.push_back(filename);
           break;
         case doing_comment:
           comment_buffer = copy;
           comment = comment_buffer.c_str();
           break;
         default:
           this->SetError("Wrong syntax. Unknown type of argument.");
           return false;
         }
      }
    }

  // Store the last command line finished.
  if(!currentLine.empty())
    {
    commandLines.push_back(currentLine);
    currentLine.clear();
    }

  // At this point we could complain about the lack of arguments.  For
  // the moment, let's say that COMMAND, TARGET are always required.
  if(output.empty() && target.empty())
    {
    this->SetError("Wrong syntax. A TARGET or OUTPUT must be specified.");
    return false;
    }

  if(source.empty() && !target.empty() && !output.empty())
    {
    this->SetError(
      "Wrong syntax. A TARGET and OUTPUT can not both be specified.");
    return false;
    }
  if(append && output.empty())
    {
    this->SetError("given APPEND option with no OUTPUT.");
    return false;
    }

  // Make sure the output names and locations are safe.
  if(!this->CheckOutputs(output) ||
     !this->CheckOutputs(outputs) ||
     !this->CheckOutputs(byproducts))
    {
    return false;
    }

  // Check for an append request.
  if(append)
    {
    // Lookup an existing command.
    if(cmSourceFile* sf =
       this->Makefile->GetSourceFileWithOutput(output[0]))
      {
      if(cmCustomCommand* cc = sf->GetCustomCommand())
        {
        cc->AppendCommands(commandLines);
        cc->AppendDepends(depends);
        cc->AppendImplicitDepends(implicit_depends);
        return true;
        }
      }

    // No command for this output exists.
    std::ostringstream e;
    e << "given APPEND option with output \"" << output[0]
      << "\" which is not already a custom command output.";
    this->SetError(e.str());
    return false;
    }

  // Convert working directory to a full path.
  if(!working.empty())
    {
    const char* build_dir = this->Makefile->GetCurrentBinaryDirectory();
    working = cmSystemTools::CollapseFullPath(working, build_dir);
    }

  // Choose which mode of the command to use.
  bool escapeOldStyle = !verbatim;
  if(source.empty() && output.empty())
    {
    // Source is empty, use the target.
    std::vector<std::string> no_depends;
    this->Makefile->AddCustomCommandToTarget(target, byproducts, no_depends,
                                             commandLines, cctype,
                                             comment, working.c_str(),
                                             escapeOldStyle, uses_terminal);
    }
  else if(target.empty())
    {
    // Target is empty, use the output.
    this->Makefile->AddCustomCommandToOutput(output, byproducts,
                                             depends, main_dependency,
                                             commandLines, comment,
                                             working.c_str(), false,
                                             escapeOldStyle, uses_terminal);

    // Add implicit dependency scanning requests if any were given.
    if(!implicit_depends.empty())
      {
      bool okay = false;
      if(cmSourceFile* sf =
         this->Makefile->GetSourceFileWithOutput(output[0]))
        {
        if(cmCustomCommand* cc = sf->GetCustomCommand())
          {
          okay = true;
          cc->SetImplicitDepends(implicit_depends);
          }
        }
      if(!okay)
        {
        std::ostringstream e;
        e << "could not locate source file with a custom command producing \""
          << output[0] << "\" even though this command tried to create it!";
        this->SetError(e.str());
        return false;
        }
      }
    }
  else if (!byproducts.empty())
    {
    this->SetError("BYPRODUCTS may not be specified with SOURCE signatures");
    return false;
    }
  else if (uses_terminal)
    {
    this->SetError("USES_TERMINAL may not be used with SOURCE signatures");
    return false;
    }
  else
    {
    bool issueMessage = true;
    std::ostringstream e;
    cmake::MessageType messageType = cmake::AUTHOR_WARNING;
    switch(this->Makefile->GetPolicyStatus(cmPolicies::CMP0050))
    {
    case cmPolicies::WARN:
      e << cmPolicies::GetPolicyWarning(cmPolicies::CMP0050) << "\n";
      break;
    case cmPolicies::OLD:
      issueMessage = false;
      break;
    case cmPolicies::REQUIRED_ALWAYS:
    case cmPolicies::REQUIRED_IF_USED:
    case cmPolicies::NEW:
      messageType = cmake::FATAL_ERROR;
      break;
    }

    if (issueMessage)
      {
      e << "The SOURCE signatures of add_custom_command are no longer "
           "supported.";
      this->Makefile->IssueMessage(messageType, e.str());
      if (messageType == cmake::FATAL_ERROR)
        {
        return false;
        }
      }

    // Use the old-style mode for backward compatibility.
    this->Makefile->AddCustomCommandOldStyle(target, outputs, depends,
                                             source, commandLines,
                                             comment);
    }

  return true;
}